

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# append_graph.cpp
# Opt level: O1

void handlegraph::algorithms::append_path_handle_graph
               (PathHandleGraph *from,MutablePathMutableHandleGraph *into,
               bool only_connect_path_tips)

{
  undefined1 uVar1;
  undefined7 in_register_00000011;
  PathHandleGraph ***pppPVar2;
  long *plVar3;
  iterator __end3;
  PathHandleGraph ***pppPVar4;
  PathHandleGraph ***pppPVar5;
  handle_t head;
  handle_t tail;
  handle_t into_head;
  HandleGraph *in_stack_ffffffffffffff58;
  undefined8 **local_a0;
  MutableHandleGraph *local_98;
  HandleGraph *in_stack_ffffffffffffff70;
  PathHandleGraph ***pppPVar6;
  MutablePathMutableHandleGraph *local_88;
  MutableHandleGraph *into_00;
  PathHandleGraph *local_78;
  undefined8 **local_70;
  PathHandleGraph ***local_68;
  undefined8 **ppuStack_60;
  MutableHandleGraph *local_58;
  code *pcStack_50;
  undefined8 *local_48;
  PathHandleGraph **local_40;
  MutablePathMutableHandleGraph **local_38;
  
  local_88 = into;
  local_78 = from;
  if ((int)CONCAT71(in_register_00000011,only_connect_path_tips) == 0) {
    head_nodes(in_stack_ffffffffffffff70);
    pppPVar2 = local_68;
    local_70 = ppuStack_60;
    into_00 = local_58;
    tail_nodes(in_stack_ffffffffffffff70);
    local_a0 = local_68;
    local_98 = local_58;
    pppPVar4 = (PathHandleGraph ***)ppuStack_60;
  }
  else {
    into_00 = (MutableHandleGraph *)0x0;
    local_a0 = (PathHandleGraph ***)0x0;
    local_98 = (MutableHandleGraph *)0x0;
    local_70 = (PathHandleGraph ***)0x0;
    pppPVar2 = (PathHandleGraph ***)0x0;
    pppPVar4 = (PathHandleGraph ***)0x0;
  }
  pppPVar5 = pppPVar2;
  copy_handle_graph(in_stack_ffffffffffffff58,into_00);
  pppPVar6 = pppPVar5;
  if (pppPVar2 != (PathHandleGraph ***)local_70) {
    do {
      local_68 = (PathHandleGraph ***)*pppPVar5;
      plVar3 = (long *)((long)&local_88->field_0x0 + *(long *)(*(long *)local_88 + -0xb0));
      local_48 = (undefined8 *)
                 (**(code **)(*(long *)((long)&local_78->field_0x0 +
                                       *(long *)(*(long *)local_78 + -0xb0)) + 0x20))
                           ((long)&local_78->field_0x0 + *(long *)(*(long *)local_78 + -0xb0),
                            &local_68);
      uVar1 = (**(code **)(*(long *)((long)&local_78->field_0x0 +
                                    *(long *)(*(long *)local_78 + -0xb0)) + 0x28))
                        ((long)&local_78->field_0x0 + *(long *)(*(long *)local_78 + -0xb0),&local_68
                        );
      local_40 = (PathHandleGraph **)(**(code **)(*plVar3 + 0x18))(plVar3,&local_48,uVar1);
      for (pppPVar2 = (PathHandleGraph ***)local_a0; pppPVar2 != pppPVar4; pppPVar2 = pppPVar2 + 1)
      {
        local_48 = *pppPVar2;
        (**(code **)(*(long *)((long)&local_88->field_0x0 + *(long *)(*(long *)local_88 + -0x1d0)) +
                    0xb0))((long)&local_88->field_0x0 + *(long *)(*(long *)local_88 + -0x1d0),
                           &local_48,&local_40);
      }
      pppPVar5 = pppPVar5 + 1;
    } while (pppPVar5 != (PathHandleGraph ***)local_70);
  }
  local_40 = &local_78;
  local_68 = &local_40;
  local_38 = &local_88;
  ppuStack_60 = (undefined8 **)0x0;
  pcStack_50 = std::
               _Function_handler<bool_(const_handlegraph::path_handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
               ::_M_invoke;
  local_58 = (MutableHandleGraph *)
             std::
             _Function_handler<bool_(const_handlegraph::path_handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_manager;
  (**(code **)(*(long *)local_78 + 0x128))();
  if (local_58 != (MutableHandleGraph *)0x0) {
    (*(code *)local_58)(&local_68,&local_68,3);
  }
  if ((PathHandleGraph ***)local_a0 != (PathHandleGraph ***)0x0) {
    operator_delete(local_a0,(long)local_98 - (long)local_a0);
  }
  if (pppPVar6 != (PathHandleGraph ***)0x0) {
    operator_delete(pppPVar6,(long)into_00 - (long)pppPVar6);
  }
  return;
}

Assistant:

void append_path_handle_graph(const PathHandleGraph* from, MutablePathMutableHandleGraph* into,
                              bool only_connect_path_tips) {

    // get the heads and tails before copying
    vector<handle_t> heads;
    vector<handle_t> tails;
    if (!only_connect_path_tips) {
        heads = algorithms::head_nodes(from);
        tails = algorithms::tail_nodes(into);
    }

    // copy over the nodes and edges
    // beware: no checking duplicates
    copy_handle_graph(from, into);
    
    // connect all the tips
    for (handle_t head : heads) {
        handle_t into_head = into->get_handle(from->get_id(head), from->get_is_reverse(head));
        for (handle_t tail : tails) {
            into->create_edge(tail, into_head);
        }
    }

    // append the paths, adding linking edges
    from->for_each_path_handle([&](const path_handle_t& path_handle) {
            string path_name = from->get_path_name(path_handle);
            if (!into->has_path(path_name)) {
                // just copy it over if it's not there
                copy_path(from, path_handle, into);
            } else {
                // else we append it
                path_handle_t into_path_handle = into->get_path_handle(path_name);
                
                // add the missing edge
                handle_t tail = into->get_handle_of_step(into->path_back(into_path_handle));
                handle_t head = from->get_handle_of_step(from->path_begin(path_handle));
                if (!into->has_edge(tail, head)) {
                    into->create_edge(tail, head);
                }
                
                // append the steps
                from->for_each_step_in_path(path_handle, [&](const step_handle_t& step_handle) {
                        handle_t handle = from->get_handle_of_step(step_handle);
                        handle_t into_handle = into->get_handle(from->get_id(handle), from->get_is_reverse(handle));
                        into->append_step(into_path_handle, into_handle);
                    });
            }                    
        });
    
}